

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 FastJsonDecode(void *pIn,sxu32 nByte,jx9_value *pOut,uchar **pzPtr,int iNest)

{
  byte bVar1;
  sxi32 sVar2;
  ushort uVar3;
  sxi32 sVar4;
  uint uVar5;
  sxu32 sVar6;
  undefined4 in_register_00000034;
  jx9_value *pObj;
  uchar *puVar7;
  uchar *puVar8;
  uchar *local_d0;
  jx9_hashmap *local_c8;
  uchar **local_c0;
  jx9_hashmap *local_b8;
  double iVal;
  jx9_value sKey;
  
  if (0x3f < iNest) {
    return -7;
  }
  puVar8 = (uchar *)((ulong)nByte + (long)pIn);
  bVar1 = *pIn;
  puVar7 = (uchar *)((long)pIn + 1);
  sVar4 = -0x18;
  uVar5 = bVar1 - 1;
  local_d0 = puVar7;
  if (uVar5 < 10) {
    local_c0 = pzPtr;
    switch((uint)bVar1) {
    case 1:
      local_b8 = jx9NewHashmap(pOut->pVm,(_func_sxu32_sxi64 *)CONCAT44(in_register_00000034,nByte),
                               (_func_sxu32_void_ptr_sxu32 *)
                               ((long)&switchD_0011822f::switchdataD_00139204 +
                               (long)(int)(&switchD_0011822f::switchdataD_00139204)[uVar5]));
      if (local_b8 != (jx9_hashmap *)0x0) {
        jx9MemObjInit(pOut->pVm,(jx9_value *)&iVal);
        jx9MemObjInit(pOut->pVm,&sKey);
        jx9MemObjRelease(pOut);
        pOut->iFlags = pOut->iFlags & 0xfffffe90U | 0x40;
        (pOut->x).pOther = local_b8;
        sVar2 = -0x18;
        while( true ) {
          sVar6 = (nByte + (int)pIn) - (int)local_d0;
          while( true ) {
            sVar4 = 0;
            if (puVar8 <= local_d0) goto LAB_00118530;
            if (*local_d0 != '\x06') break;
            local_d0 = local_d0 + 1;
            sVar6 = sVar6 - 1;
          }
          if (*local_d0 == '\x02') {
            local_d0 = local_d0 + 1;
            goto LAB_00118530;
          }
          local_c8 = (jx9_hashmap *)pOut;
          sVar4 = FastJsonDecode(local_d0,sVar6,&sKey,&local_d0,iNest + 1);
          if ((((sVar4 != 0) || (sVar4 = sVar2, puVar8 <= local_d0)) || (*local_d0 != '\x05')) ||
             (local_d0 = local_d0 + 1, puVar8 <= local_d0)) break;
          sVar4 = FastJsonDecode(local_d0,(int)puVar8 - (int)local_d0,(jx9_value *)&iVal,&local_d0,
                                 iNest + 1);
          if ((sVar4 != 0) ||
             (sVar4 = HashmapInsert(local_b8,&sKey,(jx9_value *)&iVal), pOut = (jx9_value *)local_c8
             , sVar4 != 0)) break;
        }
        jx9MemObjRelease((jx9_value *)local_c8);
LAB_00118530:
        jx9MemObjRelease((jx9_value *)&iVal);
        pObj = &sKey;
LAB_0011853f:
        jx9MemObjRelease(pObj);
        pzPtr = local_c0;
        goto switchD_001181b9_caseD_13;
      }
      break;
    default:
      goto switchD_001181b9_caseD_13;
    case 3:
      local_c8 = jx9NewHashmap(pOut->pVm,(_func_sxu32_sxi64 *)CONCAT44(in_register_00000034,nByte),
                               (_func_sxu32_void_ptr_sxu32 *)
                               ((long)&switchD_0011822f::switchdataD_00139204 +
                               (long)(int)(&switchD_0011822f::switchdataD_00139204)[uVar5]));
      if (local_c8 != (jx9_hashmap *)0x0) {
        jx9MemObjInit(pOut->pVm,(jx9_value *)&iVal);
        jx9MemObjRelease(pOut);
        pOut->iFlags = pOut->iFlags & 0xfffffe90U | 0x40;
        (pOut->x).pOther = local_c8;
        do {
          sVar6 = (nByte + (int)pIn) - (int)local_d0;
          while( true ) {
            sVar4 = 0;
            if (puVar8 <= local_d0) goto LAB_00118521;
            if (*local_d0 != '\x06') break;
            local_d0 = local_d0 + 1;
            sVar6 = sVar6 - 1;
          }
          if (*local_d0 == '\x04') {
            local_d0 = local_d0 + 1;
            goto LAB_00118521;
          }
          sVar4 = FastJsonDecode(local_d0,sVar6,(jx9_value *)&iVal,&local_d0,iNest + 1);
        } while ((sVar4 == 0) &&
                (sVar4 = HashmapInsert(local_c8,(jx9_value *)0x0,(jx9_value *)&iVal), sVar4 == 0));
        jx9MemObjRelease(pOut);
LAB_00118521:
        pObj = (jx9_value *)&iVal;
        goto LAB_0011853f;
      }
      break;
    case 8:
      if (5 < nByte) {
        local_c8 = (jx9_hashmap *)pOut;
        SyBigEndianUnpack32(puVar7,(sxu32 *)&iVal);
        if (puVar7 + ((ulong)iVal & 0xffffffff) < puVar8) {
          if ((*(sxi32 *)&local_c8->apBucket & 1) != 0) {
            SyBlobReset((SyBlob *)&local_c8->pLast);
          }
          sVar4 = jx9MemObjStringAppend((jx9_value *)local_c8,(char *)((long)pIn + 5),iVal._0_4_);
          local_d0 = (uchar *)((char *)((long)pIn + 5) + ((ulong)iVal & 0xffffffff));
        }
      }
      goto switchD_001181b9_caseD_13;
    case 10:
      if (nByte < 10) goto switchD_001181b9_caseD_13;
      SyBigEndianUnpack64(puVar7,(sxu64 *)&iVal);
      local_d0 = (uchar *)((long)pIn + 9);
      jx9_value_int64(pOut,(jx9_int64)iVal);
      goto LAB_0011850e;
    }
    sVar4 = -1;
    pzPtr = local_c0;
    goto switchD_001181b9_caseD_13;
  }
  switch(bVar1) {
  case 0x12:
    iVal = 0.0;
    if (nByte < 4) goto switchD_001181b9_caseD_13;
    uVar3 = *(ushort *)((long)pIn + 1) << 8 | *(ushort *)((long)pIn + 1) >> 8;
    if (puVar8 <= puVar7 + uVar3) goto switchD_001181b9_caseD_13;
    puVar7 = (uchar *)((long)pIn + 3);
    local_d0 = puVar7;
    SyStrToReal((char *)puVar7,(uint)uVar3,&iVal,(char **)pzPtr);
    local_d0 = puVar7 + uVar3;
    jx9_value_double(pOut,iVal);
    break;
  default:
    goto switchD_001181b9_caseD_13;
  case 0x17:
    jx9MemObjRelease(pOut);
    break;
  case 0x18:
    jx9_value_bool(pOut,1);
    break;
  case 0x19:
    sVar4 = 0;
    jx9_value_bool(pOut,0);
    goto switchD_001181b9_caseD_13;
  }
LAB_0011850e:
  sVar4 = 0;
switchD_001181b9_caseD_13:
  if (pzPtr != (uchar **)0x0) {
    *pzPtr = local_d0;
  }
  return sVar4;
}

Assistant:

UNQLITE_PRIVATE sxi32 FastJsonDecode(
	const void *pIn,  /* Binary JSON  */
	sxu32 nByte,      /* Chunk delimiter */
	jx9_value *pOut,  /* Decoded value */
	const unsigned char **pzPtr,
	int iNest /* Nesting limit */
	)
{
	const unsigned char *zIn = (const unsigned char *)pIn;
	const unsigned char *zEnd = &zIn[nByte];
	sxi32 rc = SXRET_OK;
	int c;
	if( iNest >= UNQLITE_FAST_JSON_NEST_LIMIT ){
		/* Nesting limit reached */
		return SXERR_LIMIT;
	}
	c = zIn[0];
	/* Advance the stream cursor */
	zIn++;
	/* Process the binary token */
	switch(c){
	case FJSON_NULL:
		/* null */
		jx9_value_null(pOut);
		break;
	case FJSON_FALSE:
		/* Boolean FALSE */
		jx9_value_bool(pOut,0);
		break;
	case FJSON_TRUE:
		/* Boolean TRUE */
		jx9_value_bool(pOut,1);
		break;
	case FJSON_INT64: {
		/* 64Bit integer */
		sxu64 iVal;
		/* Sanity check */
		if( &zIn[8] >= zEnd ){
			/* Corrupt chunk */
			rc = SXERR_CORRUPT;
			break;
		}
		SyBigEndianUnpack64(zIn,&iVal);
		/* Advance the pointer */
		zIn += 8;
		jx9_value_int64(pOut,(jx9_int64)iVal);
		break;
					  }
	case FJSON_REAL: {
		/* Real number */
		double iVal = 0; /* cc warning */
		sxu16 iLen;
		/* Sanity check */
		if( &zIn[2] >= zEnd ){
			/* Corrupt chunk */
			rc = SXERR_CORRUPT;
			break;
		}
		SyBigEndianUnpack16(zIn,&iLen);
		if( &zIn[iLen] >= zEnd ){
			/* Corrupt chunk */
			rc = SXERR_CORRUPT;
			break;
		}
		zIn += 2;
		SyStrToReal((const char *)zIn,(sxu32)iLen,&iVal,0);
		/* Advance the pointer */
		zIn += iLen;
		jx9_value_double(pOut,iVal);
		break;
					 }
	case FJSON_STRING: {
		/* UTF-8/Binary chunk */
		sxu32 iLength;
		/* Sanity check */
		if( &zIn[4] >= zEnd ){
			/* Corrupt chunk */
			rc = SXERR_CORRUPT;
			break;
		}
		SyBigEndianUnpack32(zIn,&iLength);
		if( &zIn[iLength] >= zEnd ){
			/* Corrupt chunk */
			rc = SXERR_CORRUPT;
			break;
		}
		zIn += 4;
		/* Invalidate any prior representation */
		if( pOut->iFlags & MEMOBJ_STRING ){
			/* Reset the string cursor */
			SyBlobReset(&pOut->sBlob);
		}
		rc = jx9MemObjStringAppend(pOut,(const char *)zIn,iLength);
		/* Update pointer */
		zIn += iLength;
		break;
					   }
	case FJSON_ARRAY_START: {
		/* Binary JSON array */
		jx9_hashmap *pMap;
		jx9_value sVal;
		/* Allocate a new hashmap */
		pMap = (jx9_hashmap *)jx9NewHashmap(pOut->pVm,0,0);
		if( pMap == 0 ){
			rc = SXERR_MEM;
			break;
		}
		jx9MemObjInit(pOut->pVm,&sVal);
		jx9MemObjRelease(pOut);
		MemObjSetType(pOut,MEMOBJ_HASHMAP);
		pOut->x.pOther = pMap;
		rc = SXRET_OK;
		for(;;){
			/* Jump leading binary commas */
			while (zIn < zEnd && zIn[0] == FJSON_COMMA ){
				zIn++;
			}
			if( zIn >= zEnd || zIn[0] == FJSON_ARRAY_END ){
				if( zIn < zEnd ){
					zIn++; /* Jump the trailing binary ] */
				}
				break;
			}
			/* Decode the value */
			rc = FastJsonDecode((const void *)zIn,(sxu32)(zEnd-zIn),&sVal,&zIn,iNest+1);
			if( rc != SXRET_OK ){
				break;
			}
			/* Insert the decoded value */
			rc = jx9HashmapInsert(pMap,0,&sVal);
			if( rc != UNQLITE_OK ){
				break;
			}
		}
		if( rc != SXRET_OK ){
			jx9MemObjRelease(pOut);
		}
		jx9MemObjRelease(&sVal);
		break;
							}
	case FJSON_DOC_START: {
		/* Binary JSON object */
		jx9_value sVal,sKey;
		jx9_hashmap *pMap;
		/* Allocate a new hashmap */
		pMap = (jx9_hashmap *)jx9NewHashmap(pOut->pVm,0,0);
		if( pMap == 0 ){
			rc = SXERR_MEM;
			break;
		}
		jx9MemObjInit(pOut->pVm,&sVal);
		jx9MemObjInit(pOut->pVm,&sKey);
		jx9MemObjRelease(pOut);
		MemObjSetType(pOut,MEMOBJ_HASHMAP);
		pOut->x.pOther = pMap;
		rc = SXRET_OK;
		for(;;){
			/* Jump leading binary commas */
			while (zIn < zEnd && zIn[0] == FJSON_COMMA ){
				zIn++;
			}
			if( zIn >= zEnd || zIn[0] == FJSON_DOC_END ){
				if( zIn < zEnd ){
					zIn++; /* Jump the trailing binary } */
				}
				break;
			}
			/* Extract the key */
			rc = FastJsonDecode((const void *)zIn,(sxu32)(zEnd-zIn),&sKey,&zIn,iNest+1);
			if( rc != UNQLITE_OK ){
				break;
			}
			if( zIn >= zEnd || zIn[0] != FJSON_COLON ){
				rc = UNQLITE_CORRUPT;
				break;
			}
			zIn++; /* Jump the binary colon ':' */
			if( zIn >= zEnd ){
				rc = UNQLITE_CORRUPT;
				break;
			}
			/* Decode the value */
			rc = FastJsonDecode((const void *)zIn,(sxu32)(zEnd-zIn),&sVal,&zIn,iNest+1);
			if( rc != SXRET_OK ){
				break;
			}
			/* Insert the key and its associated value */
			rc = jx9HashmapInsert(pMap,&sKey,&sVal);
			if( rc != UNQLITE_OK ){
				break;
			}
		}
		if( rc != SXRET_OK ){
			jx9MemObjRelease(pOut);
		}
		jx9MemObjRelease(&sVal);
		jx9MemObjRelease(&sKey);
		break;
						  }
	default:
		/* Corrupt data */
		rc = SXERR_CORRUPT;
		break;
	}
	if( pzPtr ){
		*pzPtr = zIn;
	}
	return rc;
}